

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase82::run(TestCase82 *this)

{
  undefined1 in_CL;
  EncodingResult<kj::Array<char16_t>_> local_480;
  EncodingResult<kj::Array<char16_t>_> local_460;
  EncodingResult<kj::Array<char16_t>_> local_440;
  EncodingResult<kj::Array<char16_t>_> local_420;
  EncodingResult<kj::Array<char16_t>_> local_400;
  EncodingResult<kj::Array<char16_t>_> local_3e0;
  EncodingResult<kj::Array<char16_t>_> local_3c0;
  EncodingResult<kj::Array<char16_t>_> local_3a0;
  EncodingResult<kj::Array<char16_t>_> local_380;
  EncodingResult<kj::Array<char16_t>_> local_360;
  EncodingResult<kj::Array<char16_t>_> local_340;
  EncodingResult<kj::Array<char16_t>_> local_320;
  EncodingResult<kj::Array<char16_t>_> local_300;
  EncodingResult<kj::Array<char16_t>_> local_2e0;
  EncodingResult<kj::Array<char16_t>_> local_2c0;
  EncodingResult<kj::Array<char16_t>_> local_2a0;
  EncodingResult<kj::Array<char16_t>_> local_280;
  EncodingResult<kj::Array<char16_t>_> local_260;
  EncodingResult<kj::Array<char16_t>_> local_240;
  EncodingResult<kj::Array<char16_t>_> local_220;
  EncodingResult<kj::Array<char16_t>_> local_200;
  EncodingResult<kj::Array<char16_t>_> local_1e0;
  EncodingResult<kj::Array<char16_t>_> local_1c0;
  EncodingResult<kj::Array<char16_t>_> local_1a0;
  EncodingResult<kj::Array<char16_t>_> local_180;
  EncodingResult<kj::Array<char16_t>_> local_160;
  EncodingResult<kj::Array<char16_t>_> local_140;
  EncodingResult<kj::Array<char16_t>_> local_120;
  EncodingResult<kj::Array<char16_t>_> local_100;
  EncodingResult<kj::Array<char16_t>_> local_e0;
  EncodingResult<kj::Array<char16_t>_> local_c0;
  EncodingResult<kj::Array<char16_t>_> local_a0;
  EncodingResult<kj::Array<char16_t>_> local_80;
  EncodingResult<kj::Array<char16_t>_> local_60;
  EncodingResult<kj::Array<char16_t>_> local_30;
  TestCase82 *local_10;
  TestCase82 *this_local;
  
  local_10 = this;
  encodeUtf16<2ul>(&local_30,(kj *)(anon_var_dwarf_c1f08 + 7),(char (*) [2])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_30,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_30);
  encodeUtf16<4ul>(&local_60,(kj *)anon_var_dwarf_c1d6c,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_60,&anon_var_dwarf_c1d76,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_60);
  encodeUtf16<6ul>(&local_80,(kj *)anon_var_dwarf_c1d80,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_80,&anon_var_dwarf_c1d76,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_80);
  encodeUtf16<3ul>(&local_a0,(kj *)anon_var_dwarf_c1d96,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_a0,&anon_var_dwarf_c1dac,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_a0);
  encodeUtf16<3ul>(&local_c0,(kj *)anon_var_dwarf_c1dc2,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_c0,&anon_var_dwarf_c1dac,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_c0);
  encodeUtf16<4ul>(&local_e0,(kj *)anon_var_dwarf_c1dcc,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_e0,&anon_var_dwarf_c1dac,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_e0);
  encodeUtf16<3ul>(&local_100,(kj *)anon_var_dwarf_c1dd6,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_100,&anon_var_dwarf_c1dac,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_100);
  encodeUtf16<4ul>(&local_120,(kj *)anon_var_dwarf_c1de0,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_120,&anon_var_dwarf_c1dac,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_120);
  encodeUtf16<5ul>(&local_140,(kj *)anon_var_dwarf_c1dea,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_140,&anon_var_dwarf_c1dac,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_140);
  encodeUtf16<3ul>(&local_160,(kj *)anon_var_dwarf_c1e00,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_160,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_160);
  encodeUtf16<3ul>(&local_180,(kj *)anon_var_dwarf_c1e0a,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_180,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_180);
  encodeUtf16<3ul>(&local_1a0,(kj *)anon_var_dwarf_c1e14,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1a0,(char16_t (*) [2])L"\x80",false);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_1a0);
  encodeUtf16<3ul>(&local_1c0,(kj *)anon_var_dwarf_c1e28,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1c0,(char16_t (*) [2])L"߿",false);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_1c0);
  encodeUtf16<4ul>(&local_1e0,(kj *)anon_var_dwarf_c1e3c,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1e0,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_1e0);
  encodeUtf16<4ul>(&local_200,(kj *)anon_var_dwarf_c1e46,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_200,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_200);
  encodeUtf16<4ul>(&local_220,(kj *)anon_var_dwarf_c1e50,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_220,(char16_t (*) [2])L"ࠀ",false);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_220);
  encodeUtf16<4ul>(&local_240,(kj *)anon_var_dwarf_c1e64,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_240,(char16_t (*) [2])L"",false);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_240);
  encodeUtf16<4ul>(&local_260,(kj *)anon_var_dwarf_c1e78,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_260,(char16_t (*) [2])L"\xffff",false);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_260);
  encodeUtf16<5ul>(&local_280,(kj *)anon_var_dwarf_c1e8c,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_280,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_280);
  encodeUtf16<5ul>(&local_2a0,(kj *)anon_var_dwarf_c1e96,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_2a0,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_2a0);
  encodeUtf16<5ul>(&local_2c0,(kj *)anon_var_dwarf_c1ea0,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_2c0,(char16_t (*) [3])L"𐀀",false);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_2c0);
  encodeUtf16<5ul>(&local_2e0,(kj *)anon_var_dwarf_c1eb4,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_2e0,(char16_t (*) [3])L"\x0010ffff",false);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_2e0);
  encodeUtf16<5ul>(&local_300,(kj *)anon_var_dwarf_c1ec8,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_300,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_300);
  encodeUtf16<6ul>(&local_320,(kj *)anon_var_dwarf_c1ed2,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_320,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_320);
  encodeUtf16<7ul>(&local_340,(kj *)anon_var_dwarf_c1edc,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_340,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_340);
  encodeUtf16<8ul>(&local_360,(kj *)anon_var_dwarf_c1ef2,(char (*) [8])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_360,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_360);
  encodeUtf16<9ul>(&local_380,(kj *)anon_var_dwarf_c1f08,(char (*) [9])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_380,(char16_t (*) [2])(anon_var_dwarf_c1fa0 + 1),true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_380);
  encodeUtf16<7ul>(&local_3a0,(kj *)anon_var_dwarf_c1f1e,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3a0,&anon_var_dwarf_c1f28,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_3a0);
  encodeUtf16<7ul>(&local_3c0,(kj *)anon_var_dwarf_c1f32,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3c0,&anon_var_dwarf_c1f3c,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_3c0);
  encodeUtf16<7ul>(&local_3e0,(kj *)anon_var_dwarf_c1f46,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3e0,&anon_var_dwarf_c1f50,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_3e0);
  encodeUtf16<5ul>(&local_400,(kj *)anon_var_dwarf_c1f5a,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_400,&anon_var_dwarf_c1f64,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_400);
  encodeUtf16<6ul>(&local_420,(kj *)anon_var_dwarf_c1f6e,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_420,&anon_var_dwarf_c1f78,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_420);
  encodeUtf16<9ul>(&local_440,(kj *)anon_var_dwarf_c1f82,(char (*) [9])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,5ul>
            (&local_440,&anon_var_dwarf_c1f8c,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_440);
  encodeUtf16<7ul>(&local_460,(kj *)anon_var_dwarf_c1f96,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_460,&anon_var_dwarf_c1fa0,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_460);
  encodeUtf16<7ul>(&local_480,(kj *)anon_var_dwarf_c1faa,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_480,&anon_var_dwarf_c1fb4,true);
  EncodingResult<kj::Array<char16_t>_>::~EncodingResult(&local_480);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalWithValue) {
  // This tests that if we use sigqueue() to attach a value to the signal, that value is received
  // correctly.  Note that this only works on platforms that support real-time signals -- even
  // though the signal we're sending is SIGURG, the sigqueue() system call is introduced by RT
  // signals.  Hence this test won't run on e.g. Mac OSX.
  //
  // Also, Android's bionic does not appear to support sigqueue() even though the kernel does.
  //
  // Also, this test fails on Linux on mipsel. si_value comes back as zero. No one with a mips
  // machine wants to debug the problem but they demand a patch fixing it, so we disable the test.
  // Sad. https://github.com/sandstorm-io/capnproto/issues/204

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  union sigval value;
  memset(&value, 0, sizeof(value));
  value.sival_int = 123;
  KJ_SYSCALL_HANDLE_ERRORS(sigqueue(getpid(), SIGURG, value)) {
    case ENOSYS:
      // sigqueue() not supported. Maybe running on WSL.
      KJ_LOG(WARNING, "sigqueue() is not implemented by your system; skipping test");
      return;
    default:
      KJ_FAIL_SYSCALL("sigqueue(getpid(), SIGURG, value)", error);
  }

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_QUEUE, info.si_code);
  EXPECT_EQ(123, info.si_value.sival_int);
}